

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O3

void monster_list_get_glyphs(monster_list_t *list)

{
  monster_list_entry_t *pmVar1;
  long lVar2;
  uint8_t uVar3;
  _Bool _Var4;
  long lVar5;
  long lVar6;
  
  if (0 < (int)list->entries_size) {
    lVar5 = 0x24;
    lVar6 = 0;
    do {
      pmVar1 = list->entries;
      lVar2 = *(long *)((long)pmVar1->count + lVar5 + -0x34);
      if (lVar2 != 0) {
        uVar3 = *(uint8_t *)((long)pmVar1->count + lVar5 + -0x10);
        if (uVar3 == '\0') {
          uVar3 = monster_x_attr[*(uint *)(lVar2 + 8)];
          *(uint8_t *)((long)pmVar1->count + lVar5 + -0x10) = uVar3;
        }
        if (((-1 < (char)uVar3) && ((player->opts).opt[0x10] == true)) &&
           (_Var4 = flag_has_dbg((bitflag *)(lVar2 + 0x5c),0xc,1,"entry->race->flags","RF_UNIQUE"),
           _Var4)) {
          *(undefined1 *)((long)pmVar1->count + lVar5 + -0x10) = 0x11;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar6 < (int)list->entries_size);
  }
  return;
}

Assistant:

static void monster_list_get_glyphs(monster_list_t *list)
{
	int i;

	/* Run through all monsters in the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		monster_list_entry_t *entry = &list->entries[i];
		if (entry->race == NULL)
			continue;

		/* If no monster attribute use the standard UI picture. */
		if (!entry->attr)
			entry->attr = monster_x_attr[entry->race->ridx];
		/* If purple_uniques is relevant, apply it. */
		if (!(entry->attr & 0x80) && OPT(player, purple_uniques)
				&& rf_has(entry->race->flags, RF_UNIQUE)) {
			entry->attr = COLOUR_VIOLET;
		}
	}
}